

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize.h
# Opt level: O1

void dlib::serialize<std::allocator<char>>(vector<char,_std::allocator<char>_> *item,ostream *out)

{
  pointer pcVar1;
  unsigned_long size;
  unsigned_long local_38 [4];
  
  local_38[0] = (long)(item->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                      super__Vector_impl_data._M_finish -
                (long)(item->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                      super__Vector_impl_data._M_start;
  serialize(local_38,out);
  pcVar1 = (item->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  if ((item->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data.
      _M_finish != pcVar1) {
    std::ostream::write((char *)out,(long)pcVar1);
  }
  return;
}

Assistant:

void serialize (
        const std::vector<char,alloc>& item,
        std::ostream& out
    )
    {
        try
        { 
            const unsigned long size = static_cast<unsigned long>(item.size());
            serialize(size,out); 
            if (item.size() != 0)
                out.write(&item[0], item.size());
        }
        catch (serialization_error& e)
        { throw serialization_error(e.info + "\n   while serializing object of type std::vector"); }
    }